

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProcessUNIX.c
# Opt level: O1

void kwsysProcessesUpdate(kwsysProcessInstances *newProcesses)

{
  sigset_t oldset;
  sigset_t newset;
  sigset_t sStack_118;
  sigset_t local_98;
  
  sigemptyset(&local_98);
  sigaddset(&local_98,0x11);
  sigaddset(&local_98,2);
  sigaddset(&local_98,0xf);
  sigprocmask(0,&local_98,&sStack_118);
  kwsysProcesses = *newProcesses;
  sigprocmask(2,&sStack_118,(sigset_t *)0x0);
  return;
}

Assistant:

static void kwsysProcessesUpdate(kwsysProcessInstances* newProcesses)
{
  /* Block signals while we update the set of pipes to check.
     TODO: sigprocmask is undefined for threaded apps.  See
     pthread_sigmask.  */
  sigset_t newset;
  sigset_t oldset;
  sigemptyset(&newset);
  sigaddset(&newset, SIGCHLD);
  sigaddset(&newset, SIGINT);
  sigaddset(&newset, SIGTERM);
  sigprocmask(SIG_BLOCK, &newset, &oldset);

  /* Store the new set in that seen by the signal handler.  */
  kwsysProcesses = *newProcesses;

  /* Restore the signal mask to the previous setting.  */
  sigprocmask(SIG_SETMASK, &oldset, 0);
}